

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

void cleanup_room(void)

{
  room_template *prVar1;
  room_template *p;
  
  p = room_templates;
  if (room_templates != (room_template *)0x0) {
    do {
      prVar1 = p->next;
      mem_free(p->name);
      mem_free(p->text);
      mem_free(p);
      p = prVar1;
    } while (prVar1 != (room_template *)0x0);
  }
  return;
}

Assistant:

static void cleanup_room(void)
{
	struct room_template *t, *next;
	for (t = room_templates; t; t = next) {
		next = t->next;
		mem_free(t->name);
		mem_free(t->text);
		mem_free(t);
	}
}